

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.cpp
# Opt level: O0

void __thiscall CVmStack::CVmStack(CVmStack *this,size_t max_depth,size_t reserve)

{
  vm_val_t *pvVar1;
  size_t in_RDX;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  CVmStack *in_RDI;
  
  ctx = in_RSI;
  pvVar1 = (vm_val_t *)malloc((long)(in_RSI + in_RDX + 0x19) * 0x10);
  in_RDI->arr_ = pvVar1;
  in_RDI->max_depth_ = (size_t)in_RSI;
  in_RDI->reserve_depth_ = in_RDX;
  in_RDI->reserve_in_use_ = 0;
  init(in_RDI,ctx);
  return;
}

Assistant:

CVmStack::CVmStack(size_t max_depth, size_t reserve)
{
    /* 
     *   Allocate the array of stack elements.  Allocate the requested
     *   maximum depth plus the requested reserve space.  Overallocate by a
     *   few elements to leave ourselves a little buffer against mild
     *   overages - for the most part, we count on the compiler to check for
     *   proper stack usage at entry to each function, but intrinsics
     *   sometimes push a few elements without checking.  
     */
    arr_ = (vm_val_t *)t3malloc((max_depth + reserve + 25) * sizeof(arr_[0]));
    
    /* remember the maximum depth and the reserve depth */
    max_depth_ = max_depth;
    reserve_depth_ = reserve;

    /* the reserve is not yet in use */
    reserve_in_use_ = FALSE;

    /* initialize the stack pointer */
    init();
}